

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void running_frame(void)

{
  uint8_t uVar1;
  bool bVar2;
  int iVar3;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *__lhs;
  uint16_t in_stack_0000000e;
  machine_t *in_stack_00000010;
  undefined4 in_stack_ffffffffffffffc8;
  mode_t in_stack_ffffffffffffffcc;
  machine_t *in_stack_ffffffffffffffd0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffd8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffe0;
  stats_t *in_stack_fffffffffffffff0;
  
  uVar1 = E64::machine_t::run(in_stack_00000010,in_stack_0000000e);
  if (uVar1 != '\0') {
    E64::machine_t::switch_mode(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  if (((machine.vicv)->frame_done & 1U) != 0) {
    (machine.vicv)->frame_done = false;
    iVar3 = E64::sdl2_process_events();
    if (iVar3 == -1) {
      machine.turned_on = false;
    }
    E64::stats_t::process_parameters((stats_t *)in_stack_ffffffffffffffd0);
    E64::stats_t::start_idle_time((stats_t *)in_stack_ffffffffffffffd0);
    bVar2 = E64::video_t::vsync_disabled(host.video);
    if (bVar2) {
      std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<unsigned_int,void>
                ((duration<long,std::ratio<1l,1000000l>> *)&stack0xfffffffffffffff0,&stats.frametime
                );
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::
      duration<long,std::ratio<1l,1000000l>,void>
                (&in_stack_ffffffffffffffe0->__d,
                 (duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffffd8);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::operator+=((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_ffffffffffffffd0,
                   (duration *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      std::chrono::_V2::steady_clock::now();
      bVar2 = std::chrono::operator<(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      if (bVar2) {
        __lhs = (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                 *)std::chrono::_V2::steady_clock::now();
        std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<unsigned_int,void>
                  ((duration<long,std::ratio<1l,1000000l>> *)&stack0xffffffffffffffd0,
                   &stats.frametime);
        refresh_moment =
             std::chrono::operator+
                       (__lhs,(duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffffd0
                       );
      }
      std::this_thread::
      sleep_until<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)in_stack_ffffffffffffffd0);
    }
    E64::video_t::update_screen((video_t *)in_stack_ffffffffffffffd0);
    E64::stats_t::end_idle_time(in_stack_fffffffffffffff0);
  }
  return;
}

Assistant:

static void running_frame()
{
	if (machine.run(63)) machine.switch_mode(E64::MONITOR);
	if (machine.vicv->frame_done) {
		machine.vicv->frame_done = false;
		if (E64::sdl2_process_events() == E64::QUIT_EVENT) {
			machine.turned_on = false;
		}
		stats.process_parameters();
		/*
		 * If vsync is enabled, the update screen function takes more
		 * time, i.e. it will return after a few milliseconds, exactly
		 * when vertical refresh is done. This will avoid tearing.
		 * Moreover, there's no need then to let the system sleep with a
		 * calculated value. But we will still have to do a time
		 * measurement for estimation of idle time.
		 */
		stats.start_idle_time();
		if (host.video->vsync_disabled()) {
			refresh_moment +=
				std::chrono::microseconds(stats.frametime);
			/*
			 * Check if the next update is in the past,
			 * this can be the result of a debug session.
			 * If so, calculate a new update moment. This will
			 * avoid "playing catch-up" by the virtual machine.
			 */
			if (refresh_moment < std::chrono::steady_clock::now())
				refresh_moment = std::chrono::steady_clock::now() +
					std::chrono::microseconds(stats.frametime);
			std::this_thread::sleep_until(refresh_moment);
		}
		host.video->update_screen();
		stats.end_idle_time();
	}
}